

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O2

double av1_get_max_bitrate_for_level(AV1_LEVEL level_index,int tier,BITSTREAM_PROFILE profile)

{
  undefined7 in_register_00000039;
  double dVar1;
  
  dVar1 = get_max_bitrate(av1_level_defs + (CONCAT71(in_register_00000039,level_index) & 0xffffffff)
                          ,tier,profile);
  return dVar1;
}

Assistant:

double av1_get_max_bitrate_for_level(AV1_LEVEL level_index, int tier,
                                     BITSTREAM_PROFILE profile) {
  assert(is_valid_seq_level_idx(level_index));
  return get_max_bitrate(&av1_level_defs[level_index], tier, profile);
}